

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O1

void __thiscall DCanvas::GetBlock(DCanvas *this,int x,int y,int _width,int _height,BYTE *dest)

{
  BYTE *__src;
  
  if ((((x < 0) || (y < 0)) || (this->Width < _width + x)) || (this->Height < _height + y)) {
    I_Error("Bad V_GetBlock");
  }
  if (_height != 0) {
    __src = this->Buffer + (long)x + (long)y * (long)this->Pitch;
    do {
      memcpy(dest,__src,(long)_width);
      __src = __src + this->Pitch;
      dest = dest + _width;
      _height = _height + -1;
    } while (_height != 0);
  }
  return;
}

Assistant:

void DCanvas::GetBlock (int x, int y, int _width, int _height, BYTE *dest) const
{
	const BYTE *src;

#ifdef RANGECHECK 
	if (x<0
		||x+_width > Width
		|| y<0
		|| y+_height>Height)
	{
		I_Error ("Bad V_GetBlock");
	}
#endif

	src = Buffer + y*Pitch + x;

	while (_height--)
	{
		memcpy (dest, src, _width);
		src += Pitch;
		dest += _width;
	}
}